

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O0

int imm_dec(pt_ild *ild,uint8_t length)

{
  byte bVar1;
  int errcode;
  uint8_t length_local;
  pt_ild *ild_local;
  
  if (ild == (pt_ild *)0x0) {
    ild_local._4_4_ = 0xffffffff;
  }
  else {
    ild_local._4_4_ = set_imm_bytes(ild);
    if (-1 < (int)ild_local._4_4_) {
      bVar1 = length + ild->imm1_bytes + ild->imm2_bytes;
      if (ild->max_bytes < bVar1) {
        ild_local._4_4_ = 0xfffffff2;
      }
      else {
        ild_local._4_4_ = (uint)bVar1;
      }
    }
  }
  return ild_local._4_4_;
}

Assistant:

static int imm_dec(struct pt_ild *ild, uint8_t length)
{
	int errcode;

	if (!ild)
		return -pte_internal;

	errcode = set_imm_bytes(ild);
	if (errcode < 0)
		return errcode;

	length += ild->imm1_bytes;
	length += ild->imm2_bytes;
	if (ild->max_bytes < length)
		return -pte_bad_insn;

	return length;
}